

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O3

void __thiscall embree::Tutorial::Tutorial(Tutorial *this)

{
  CommandLineParser *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_class_1_0_00000001_for_f local_61;
  string local_60;
  string local_40;
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"pathtracer","");
  SceneLoadingTutorialApplication::SceneLoadingTutorialApplication
            (&this->super_SceneLoadingTutorialApplication,&local_60,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  (this->super_SceneLoadingTutorialApplication).super_TutorialApplication.super_Application.
  _vptr_Application = (_func_int **)&PTR__SceneLoadingTutorialApplication_002cbc30;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"spp","");
  paVar2 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"--spp <int>: sets number of samples per pixel","");
  this_00 = &(this->super_SceneLoadingTutorialApplication).super_TutorialApplication.
             super_Application.commandLineParser;
  CommandLineParser::
  registerOption<embree::Tutorial::Tutorial()::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_1_>
            (this_00,&local_60,&local_61,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"max-path-length","");
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "--max-path-length <int>: sets maximal path length (1=primary+shadow)","");
  CommandLineParser::
  registerOption<embree::Tutorial::Tutorial()::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_2_>
            (this_00,&local_60,(anon_class_1_0_00000001_for_f *)&local_61,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"accumulate","");
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"--accumulate <bool>: accumulate samples (on by default)","");
  CommandLineParser::
  registerOption<embree::Tutorial::Tutorial()::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_3_>
            (this_00,&local_60,(anon_class_1_0_00000001_for_f *)&local_61,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

Tutorial()
      : SceneLoadingTutorialApplication(NAME,FEATURES)
    {
      registerOption("spp", [] (Ref<ParseStream> cin, const FileName& path) {
          g_spp = cin->getInt();
        }, "--spp <int>: sets number of samples per pixel");

      registerOption("max-path-length", [] (Ref<ParseStream> cin, const FileName& path) {
          g_max_path_length = cin->getInt();
        }, "--max-path-length <int>: sets maximal path length (1=primary+shadow)");

      registerOption("accumulate", [] (Ref<ParseStream> cin, const FileName& path) {
          g_accumulate = cin->getInt();
        }, "--accumulate <bool>: accumulate samples (on by default)");
    }